

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fancy_tools.cxx
# Opt level: O0

void __thiscall fancy_tools::fix_fences(fancy_tools *this,char *section)

{
  xr_ini_file *this_00;
  xr_file_system *sname;
  bool bVar1;
  char cVar2;
  uint32_t uVar3;
  xr_memory_writer *pxVar4;
  long lVar5;
  char *pcVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  string *psVar10;
  void *pvVar11;
  size_t sVar12;
  allocator<char> local_109;
  string local_108;
  undefined4 local_e4;
  ulong local_e0;
  size_type comma;
  size_type slash;
  string lm;
  string base;
  string shader;
  string raw;
  size_t n;
  xr_reader *s;
  uint chunk_id;
  xr_memory_writer *local_30;
  xr_memory_writer *w;
  xr_reader *r;
  xr_file_system *fs;
  char *section_local;
  fancy_tools *this_local;
  
  fs = (xr_file_system *)section;
  section_local = (char *)this;
  r = (xr_reader *)xray_re::xr_file_system::instance();
  w = (xr_memory_writer *)xray_re::xr_file_system::r_open((xr_file_system *)r,"$level$","level");
  if (w == (xr_memory_writer *)0x0) {
    xray_re::msg("can\'t load %s","level");
  }
  else {
    pxVar4 = (xr_memory_writer *)operator_new(0x2078);
    xray_re::xr_memory_writer::xr_memory_writer(pxVar4);
    n = 0;
    local_30 = pxVar4;
    while (n = (size_t)xray_re::xr_reader::open_chunk_next
                                 ((xr_reader *)w,(uint32_t *)&s,(xr_reader *)n),
          (xr_reader *)n != (xr_reader *)0x0) {
      xray_re::xr_writer::open_chunk(&local_30->super_xr_writer,(uint32_t)s);
      pxVar4 = local_30;
      if ((uint32_t)s == 2) {
        uVar3 = xray_re::xr_reader::r_u32((xr_reader *)n);
        xray_re::xr_writer::w_size_u32(&local_30->super_xr_writer,(ulong)uVar3);
        raw.field_2._8_8_ = (ulong)uVar3;
        while (raw.field_2._8_8_ != 0) {
          std::__cxx11::string::string((string *)(shader.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(base.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(lm.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)&slash);
          xray_re::xr_reader::r_sz((xr_reader *)n,(string *)(shader.field_2._M_local_buf + 8));
          comma = std::__cxx11::string::find((char)&shader + '\x18',0x2f);
          if (comma == 0xffffffffffffffff) {
            xray_re::xr_writer::w_sz
                      (&local_30->super_xr_writer,(string *)((long)&shader.field_2 + 8));
            local_e4 = 4;
          }
          else {
            std::__cxx11::string::assign
                      ((string *)(base.field_2._M_local_buf + 8),(ulong)((long)&shader.field_2 + 8),
                       0);
            comma = comma + 1;
            local_e0 = std::__cxx11::string::find((char)&shader + '\x18',0x2c);
            if (local_e0 == 0xffffffffffffffff) {
              std::__cxx11::string::assign
                        ((string *)(lm.field_2._M_local_buf + 8),(ulong)((long)&shader.field_2 + 8),
                         comma);
            }
            else {
              std::__cxx11::string::assign
                        ((string *)(lm.field_2._M_local_buf + 8),(ulong)((long)&shader.field_2 + 8),
                         comma);
              local_e0 = local_e0 + 1;
              std::__cxx11::string::assign
                        ((string *)&slash,(ulong)((long)&shader.field_2 + 8),local_e0);
            }
            lVar5 = std::__cxx11::string::find(base.field_2._M_local_buf + 8,0x2d81e4);
            sname = fs;
            if (lVar5 == -1) {
              this_00 = this->m_ini;
              pcVar6 = (char *)std::__cxx11::string::c_str();
              bVar1 = xray_re::xr_ini_file::line_exist(this_00,(char *)sname,pcVar6);
              if (bVar1) {
                uVar7 = std::__cxx11::string::c_str();
                uVar8 = std::__cxx11::string::c_str();
                cVar2 = std::__cxx11::string::empty();
                pcVar6 = "";
                if (cVar2 != '\0') {
                  pcVar6 = "_v";
                }
                xray_re::msg("%s: %s -> %s%s",uVar7,uVar8,"def_shaders\\def_aref",pcVar6);
                std::__cxx11::string::operator=
                          ((string *)(base.field_2._M_local_buf + 8),"def_shaders\\def_aref");
                uVar9 = std::__cxx11::string::empty();
                if ((uVar9 & 1) != 0) {
                  std::__cxx11::string::operator+=((string *)(base.field_2._M_local_buf + 8),"_v");
                }
              }
            }
            uVar9 = std::__cxx11::string::assign((string *)(shader.field_2._M_local_buf + 8));
            psVar10 = (string *)std::__cxx11::string::append(uVar9,'\x01');
            std::__cxx11::string::append(psVar10);
            uVar9 = std::__cxx11::string::empty();
            if ((uVar9 & 1) == 0) {
              psVar10 = (string *)
                        std::__cxx11::string::append((ulong)((long)&shader.field_2 + 8),'\x01');
              std::__cxx11::string::append(psVar10);
            }
            xray_re::xr_writer::w_sz
                      (&local_30->super_xr_writer,(string *)((long)&shader.field_2 + 8));
            local_e4 = 0;
          }
          std::__cxx11::string::~string((string *)&slash);
          std::__cxx11::string::~string((string *)(lm.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(base.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(shader.field_2._M_local_buf + 8));
          raw.field_2._8_8_ = raw.field_2._8_8_ + -1;
        }
      }
      else {
        pvVar11 = xray_re::xr_reader::data((xr_reader *)n);
        sVar12 = xray_re::xr_reader::size((xr_reader *)n);
        (*(pxVar4->super_xr_writer)._vptr_xr_writer[2])(pxVar4,pvVar11,sVar12);
      }
      xray_re::xr_writer::close_chunk(&local_30->super_xr_writer);
    }
    xray_re::xr_file_system::r_close((xr_file_system *)r,(xr_reader **)&w);
    pxVar4 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"level",&local_109);
    xray_re::xr_memory_writer::save_to(pxVar4,"$fancy_level$",&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    if (local_30 != (xr_memory_writer *)0x0) {
      (*(local_30->super_xr_writer)._vptr_xr_writer[1])();
    }
  }
  return;
}

Assistant:

void fancy_tools::fix_fences(const char* section) const
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(PA_LEVEL, "level");
	if (r == 0) {
		msg("can't load %s", "level");
		return;
	}

	xr_memory_writer* w = new xr_memory_writer();

	unsigned chunk_id;
	for (xr_reader* s = 0; (s = r->open_chunk_next(chunk_id, s)) != 0;) {
		w->open_chunk(chunk_id);
		if (chunk_id == FSL13_SHADERS) {
			size_t n = s->r_u32();
			w->w_size_u32(n);
			while (n--) {
				std::string raw, shader, base, lm;
				s->r_sz(raw);
				std::string::size_type slash = raw.find('/'), comma;
				if (slash == std::string::npos) {
					w->w_sz(raw);
					continue;
				}
				shader.assign(raw, 0, slash);
				comma = raw.find(',', ++slash);
				if (comma == std::string::npos) {
					base.assign(raw, slash, std::string::npos);
				} else {
					base.assign(raw, slash, comma - slash);
					lm.assign(raw, ++comma, std::string::npos);
				}
				if (shader.find("def_shaders\\def_aref") == std::string::npos &&
						m_ini->line_exist(section, base.c_str())) {
					msg("%s: %s -> %s%s", base.c_str(), shader.c_str(),
							"def_shaders\\def_aref", lm.empty() ? "_v" : "");
					shader = "def_shaders\\def_aref";
					if (lm.empty())
						shader += "_v";
				}
				raw.assign(shader).append(1, '/').append(base);
				if (!lm.empty())
					raw.append(1, ',').append(lm);
				w->w_sz(raw);
			}
		} else {
			w->w_raw(s->data(), s->size());
		}
		w->close_chunk();
	}
	fs.r_close(r);
	w->save_to(PA_FANCY_LEVEL, "level");
	delete w;
}